

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof.cpp
# Opt level: O2

int32_t uspoof_check2UTF8_63
                  (USpoofChecker *sc,char *id,int32_t length,USpoofCheckResult *checkResult,
                  UErrorCode *status)

{
  int32_t iVar1;
  char *pcVar2;
  USpoofCheckResult *pUVar3;
  undefined4 in_register_00000014;
  StringPiece utf8;
  UnicodeString idStr;
  UnicodeString local_70;
  
  pcVar2 = (char *)CONCAT44(in_register_00000014,length);
  iVar1 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar3 = checkResult;
    if (length < 0) {
      pcVar2 = (char *)strlen(id);
    }
    utf8._8_8_ = pUVar3;
    utf8.ptr_ = pcVar2;
    icu_63::UnicodeString::fromUTF8(&local_70,(UnicodeString *)id,utf8);
    iVar1 = uspoof_check2UnicodeString_63(sc,&local_70,checkResult,status);
    icu_63::UnicodeString::~UnicodeString(&local_70);
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uspoof_check2UTF8(const USpoofChecker *sc,
    const char *id, int32_t length,
    USpoofCheckResult* checkResult,
    UErrorCode *status) {

    if (U_FAILURE(*status)) {
        return 0;
    }
    UnicodeString idStr = UnicodeString::fromUTF8(StringPiece(id, length>=0 ? length : static_cast<int32_t>(uprv_strlen(id))));
    int32_t result = uspoof_check2UnicodeString(sc, idStr, checkResult, status);
    return result;
}